

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkaccessfilebackend_p.cpp
# Opt level: O0

int __thiscall
QNetworkAccessFileBackend::qt_metacall(QNetworkAccessFileBackend *this,Call _c,int _id,void **_a)

{
  QObject *in_RCX;
  int in_ESI;
  QNetworkAccessBackend *in_RDI;
  long in_FS_OFFSET;
  void **in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  Call in_stack_ffffffffffffffc4;
  int local_28;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = QNetworkAccessBackend::qt_metacall
                       (in_RDI,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffb8);
  if (-1 < local_28) {
    if (in_ESI == 0) {
      if (local_28 < 1) {
        qt_static_metacall(in_RCX,(Call)((ulong)in_RDI >> 0x20),(int)in_RDI,
                           (void **)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      }
      local_28 = local_28 + -1;
    }
    if (in_ESI == 7) {
      if (local_28 < 1) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        **(undefined8 **)in_RCX = local_10.d_ptr;
      }
      local_28 = local_28 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

int QNetworkAccessFileBackend::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QNetworkAccessBackend::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}